

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase480::run(TestCase480 *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  int iVar4;
  char (*in_RDX) [4];
  char (*extraout_RDX) [4];
  char (*extraout_RDX_00) [4];
  char (*extraout_RDX_01) [4];
  char (*extraout_RDX_02) [4];
  char (*params) [4];
  char *ptrCopy;
  char *ptrCopy_1;
  DebugComparison<int,_int> _kjCondition;
  String local_d8;
  char *local_b8;
  size_t sStack_b0;
  ArrayDisposer *local_a8;
  DebugComparison<int,_int> local_a0;
  undefined1 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ArrayDisposer *local_68;
  undefined1 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ArrayDisposer *local_48;
  StringPtr local_40;
  
  str<char_const(&)[4]>(&local_d8,(kj *)0x1d46ba,in_RDX);
  pAVar3 = local_d8.content.disposer;
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  local_60 = 1;
  local_48 = local_d8.content.disposer;
  local_d8.content.ptr = (char *)0x0;
  local_d8.content.size_ = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_b8 = pcVar1;
  sStack_b0 = sVar2;
  local_40.content.ptr = pcVar1;
  if (sVar2 == 0) {
    local_40.content.ptr = "";
  }
  local_40.content.size_ = sVar2 + (sVar2 == 0);
  local_a8 = local_d8.content.disposer;
  local_a0.left = StringPtr::parseAs<int>(&local_40);
  params = extraout_RDX;
  if (pcVar1 != (char *)0x0) {
    local_b8 = (char *)0x0;
    sStack_b0 = 0;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
    params = extraout_RDX_00;
  }
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  local_a0.result = local_a0.left == 0x7b;
  local_a0.right = 0x7b;
  local_a0.op.content.ptr = " == ";
  local_a0.op.content.size_ = 5;
  if (local_d8.content.ptr != (char *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    params = extraout_RDX_01;
  }
  if (((local_a0.result & 1U) == 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x1f2,ERROR,
               "\"failed: expected \" \"func(kj::str(\\\"123\\\")) == 123\", _kjCondition",
               (char (*) [45])"failed: expected func(kj::str(\"123\")) == 123",&local_a0);
    params = extraout_RDX_02;
  }
  str<char_const(&)[4]>(&local_d8,(kj *)0x1d46ba,params);
  pAVar3 = local_d8.content.disposer;
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  local_80 = 1;
  local_68 = local_d8.content.disposer;
  local_d8.content.ptr = (char *)0x0;
  local_d8.content.size_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_b8 = pcVar1;
  sStack_b0 = sVar2;
  local_40.content.ptr = "";
  if (sVar2 != 0) {
    local_40.content.ptr = pcVar1;
  }
  local_40.content.size_ = sVar2 + (sVar2 == 0);
  local_a8 = local_d8.content.disposer;
  iVar4 = StringPtr::parseAs<int>(&local_40);
  if (pcVar1 != (char *)0x0) {
    local_b8 = (char *)0x0;
    sStack_b0 = 0;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  local_a0.result = iVar4 == 0x7b;
  local_a0.right = 0x7b;
  local_a0.op.content.ptr = " == ";
  local_a0.op.content.size_ = 5;
  local_a0.left = iVar4;
  if (local_d8.content.ptr != (char *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((iVar4 != 0x7b) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x220,ERROR,
               "\"failed: expected \" \"func(kj::str(\\\"123\\\")) == 123\", _kjCondition",
               (char (*) [45])"failed: expected func(kj::str(\"123\")) == 123",&local_a0);
  }
  return;
}

Assistant:

TEST(Common, MaybeUnwrapOrReturn) {
  {
    auto func = [](Maybe<int> i) -> int {
      int& j = KJ_UNWRAP_OR_RETURN(i, -1);
      KJ_EXPECT(&j == &KJ_ASSERT_NONNULL(i));
      return j + 2;
    };

    KJ_EXPECT(func(123) == 125);
    KJ_EXPECT(func(kj::none) == -1);
  }

  {
    auto func = [&](Maybe<String> maybe) -> int {
      String str = KJ_UNWRAP_OR_RETURN(kj::mv(maybe), -1);
      return str.parseAs<int>();
    };

    KJ_EXPECT(func(kj::str("123")) == 123);
    KJ_EXPECT(func(kj::none) == -1);
  }

  // Test void return.
  {
    int val = 0;
    auto func = [&](Maybe<int> i) {
      val = KJ_UNWRAP_OR_RETURN(i);
    };

    func(123);
    KJ_EXPECT(val == 123);
    val = 321;
    func(kj::none);
    KJ_EXPECT(val == 321);
  }

  // Test KJ_UNWRAP_OR
  {
    bool wasNull = false;
    auto func = [&](Maybe<int> i) -> int {
      int& j = KJ_UNWRAP_OR(i, {
        wasNull = true;
        return -1;
      });
      KJ_EXPECT(&j == &KJ_ASSERT_NONNULL(i));
      return j + 2;
    };

    KJ_EXPECT(func(123) == 125);
    KJ_EXPECT(!wasNull);
    KJ_EXPECT(func(kj::none) == -1);
    KJ_EXPECT(wasNull);
  }

  {
    bool wasNull = false;
    auto func = [&](Maybe<String> maybe) -> int {
      String str = KJ_UNWRAP_OR(kj::mv(maybe), {
        wasNull = true;
        return -1;
      });
      return str.parseAs<int>();
    };

    KJ_EXPECT(func(kj::str("123")) == 123);
    KJ_EXPECT(!wasNull);
    KJ_EXPECT(func(kj::none) == -1);
    KJ_EXPECT(wasNull);
  }

  // Test void return.
  {
    int val = 0;
    auto func = [&](Maybe<int> i) {
      val = KJ_UNWRAP_OR(i, {
        return;
      });
    };

    func(123);
    KJ_EXPECT(val == 123);
    val = 321;
    func(kj::none);
    KJ_EXPECT(val == 321);
  }

}